

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.hpp
# Opt level: O3

void __thiscall
gl3cts::ClipDistance::Utility::VertexBufferObject<int>::~VertexBufferObject
          (VertexBufferObject<int> *this)

{
  GLenum err;
  GLuint *pGVar1;
  
  (*this->m_gl->deleteBuffers)(1,&this->m_vertex_buffer_object_id);
  err = (*this->m_gl->getError)();
  glu::checkError(err,"glDeleteBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                  ,0x161);
  pGVar1 = (GLuint *)
           (this->m_enabled_arrays).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pGVar1 != (GLuint *)
                (this->m_enabled_arrays).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      (*this->m_gl->disableVertexAttribArray)(*pGVar1);
      pGVar1 = pGVar1 + 1;
    } while (pGVar1 != (GLuint *)
                       (this->m_enabled_arrays).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    pGVar1 = (GLuint *)
             (this->m_enabled_arrays).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (pGVar1 != (GLuint *)0x0) {
    operator_delete(pGVar1,(long)(this->m_enabled_arrays).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pGVar1);
    return;
  }
  return;
}

Assistant:

gl3cts::ClipDistance::Utility::VertexBufferObject<T>::~VertexBufferObject()
{
	m_gl.deleteBuffers(1, &m_vertex_buffer_object_id); /* Delete silently unbinds the buffer. */
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDeleteBuffers call failed.");

	for (std::vector<glw::GLint>::iterator i_enabled_array = m_enabled_arrays.begin();
		 i_enabled_array != m_enabled_arrays.end(); ++i_enabled_array)
	{
		m_gl.disableVertexAttribArray(*i_enabled_array);
	}
}